

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O3

bool __thiscall iDynTree::Model::isFrameNameUsed(Model *this,string *frameName)

{
  pointer pLVar1;
  pointer pLVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  size_type *psVar6;
  ulong uVar7;
  
  pLVar1 = (this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pLVar2 = (this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar7 = ((long)pLVar1 - (long)pLVar2 >> 4) * 0x6db6db6db6db6db7;
  if (pLVar1 != pLVar2) {
    sVar3 = frameName->_M_string_length;
    lVar5 = uVar7 + (uVar7 == 0);
    psVar6 = &((this->linkNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    do {
      if (sVar3 == *psVar6) {
        if (sVar3 == 0) {
          return true;
        }
        iVar4 = bcmp((frameName->_M_dataplus)._M_p,
                     (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (psVar6 + -1))->_M_dataplus)._M_p,sVar3);
        if (iVar4 == 0) {
          return true;
        }
      }
      psVar6 = psVar6 + 4;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  lVar5 = ((long)(this->additionalFrames).
                 super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->additionalFrames).
                 super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
  if (uVar7 < lVar5 + uVar7) {
    sVar3 = frameName->_M_string_length;
    psVar6 = &((this->frameNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    do {
      if (sVar3 == *psVar6) {
        if (sVar3 == 0) {
          return true;
        }
        iVar4 = bcmp((frameName->_M_dataplus)._M_p,
                     (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (psVar6 + -1))->_M_dataplus)._M_p,sVar3);
        if (iVar4 == 0) {
          return true;
        }
      }
      psVar6 = psVar6 + 4;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  return false;
}

Assistant:

bool Model::isFrameNameUsed(const std::string frameName) const
{
    for(size_t i=0; i < this->getNrOfLinks(); i++ )
    {
        if( frameName == linkNames[i] )
        {
            return true;
        }
    }

    for(size_t i=this->getNrOfLinks(); i < this->getNrOfFrames(); i++ )
    {
        if( frameName == this->frameNames[i-getNrOfLinks()] )
        {
            return true;
        }
    }

    return false;
}